

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  uint *puVar1;
  uint uVar2;
  int value;
  pointer pUVar3;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  LogMessage *pLVar7;
  long lVar8;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar9;
  long lVar10;
  long lVar11;
  UnknownFieldSet intermediate_unknown_fields;
  undefined1 local_88 [16];
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    pvVar9 = unknown_fields->fields_;
    lVar11 = -1;
    lVar10 = 0;
    while( true ) {
      if (pvVar9 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     *)0x0) {
        lVar8 = 0;
      }
      else {
        lVar8 = (long)(int)((ulong)((long)(pvVar9->
                                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar9->
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      lVar11 = lVar11 + 1;
      if (lVar8 <= lVar11) break;
      puVar1 = (uint *)(&((pvVar9->
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          )._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar10);
      lVar10 = lVar10 + 0x10;
      if ((*puVar1 & 0x1fffffff) == *(uint *)(innermost_field + 0x28)) {
        std::operator+(&local_50,"Option \"",debug_msg_name);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        pvVar9 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)(plVar6 + 2);
        if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)*plVar6 == pvVar9) {
          local_78.
          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pvVar9->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_78.
          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar6[3];
          local_88._0_8_ = &local_78;
        }
        else {
          local_78.
          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pvVar9->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_88._0_8_ =
               (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)*plVar6;
        }
        local_88._8_8_ = plVar6[1];
        *plVar6 = (long)pvVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_88);
        if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)local_88._0_8_ != &local_78) {
          operator_delete((void *)local_88._0_8_,
                          (ulong)((long)local_78.
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        return lVar8 <= lVar11;
      }
    }
    return lVar8 <= lVar11;
  }
  lVar10 = 8;
  lVar11 = 0;
  do {
    pvVar9 = unknown_fields->fields_;
    if (pvVar9 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar8 = 0;
    }
    else {
      lVar8 = (long)(int)((ulong)((long)(pvVar9->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar9->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    bVar4 = lVar8 <= lVar11;
    if (lVar8 <= lVar11) {
      return bVar4;
    }
    pUVar3 = (pvVar9->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar2 = *(uint *)((long)pUVar3 + lVar10 + -8);
    if (((uVar2 & 0x1fffffff) == *(uint *)(*intermediate_fields_iter._M_current + 0x28)) &&
       (value = *(int *)(*intermediate_fields_iter._M_current + 0x2c), value != 10)) {
      if (value != 0xb) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                   ,0x11ca);
        pLVar7 = internal::LogMessage::operator<<
                           ((LogMessage *)local_88,"Invalid wire type for CPPTYPE_MESSAGE: ");
        pLVar7 = internal::LogMessage::operator<<(pLVar7,value);
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar7);
        internal::LogMessage::~LogMessage((LogMessage *)local_88);
        return bVar4;
      }
      if ((uVar2 & 0xe0000000) == 0x60000000) {
        UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)local_88);
        if ((*(uint *)((long)pUVar3 + lVar10 + -8) & 0xe0000000) != 0x60000000) {
          __assert_fail("type_ == TYPE_LENGTH_DELIMITED",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/unknown_field_set.h"
                        ,0x10e,
                        "const string &google::protobuf::UnknownField::length_delimited() const");
        }
        bVar5 = UnknownFieldSet::ParseFromArray
                          ((UnknownFieldSet *)local_88,
                           (void *)**(undefined8 **)(&pUVar3->field_0x0 + lVar10),
                           *(int *)(*(undefined8 **)(&pUVar3->field_0x0 + lVar10) + 1));
        if ((bVar5) &&
           (bVar5 = ExamineIfOptionIsSet
                              (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                               intermediate_fields_end,innermost_field,debug_msg_name,
                               (UnknownFieldSet *)local_88), !bVar5)) {
          UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)local_88);
          return bVar4;
        }
        UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)local_88);
      }
    }
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    vector<const FieldDescriptor*>::const_iterator intermediate_fields_iter,
    vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}